

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

int NGA_Create_irreg_config64
              (int type,int ndim,int64_t *dims,char *name,int64_t *block,int64_t *map,int p_handle)

{
  ulong uVar1;
  Integer *pIVar2;
  logical lVar3;
  ulong uVar4;
  int iVar5;
  Integer g_a;
  Integer _ga_work [7];
  Integer _ga_dims [7];
  
  iVar5 = 0;
  if (ndim < 8) {
    uVar1 = (ulong)(uint)ndim;
    uVar4 = uVar1;
    if (0 < ndim) {
      do {
        _ga_dims[uVar4 - 1] = *dims;
        dims = dims + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    pIVar2 = block;
    if (0 < ndim) {
      do {
        _ga_work[uVar1 - 1] = *pIVar2;
        uVar1 = uVar1 - 1;
        pIVar2 = pIVar2 + 1;
      } while (uVar1 != 0);
    }
    pIVar2 = copy_map64(block,ndim,map);
    _ga_irreg_flag = 1;
    lVar3 = pnga_create_irreg_config
                      ((long)type,(long)ndim,_ga_dims,name,pIVar2,_ga_work,(long)p_handle,&g_a);
    _ga_irreg_flag = 0;
    free(pIVar2);
    iVar5 = 0;
    if (lVar3 == 1) {
      iVar5 = (int)g_a;
    }
  }
  return iVar5;
}

Assistant:

int NGA_Create_irreg_config64(int type,int ndim,int64_t dims[],char *name,int64_t block[], int64_t map[], int p_handle)
{
    Integer g_a;
    logical st;
    Integer _ga_dims[MAXDIM];
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;
    if(ndim>MAXDIM)return 0;

    COPYC2F(dims,_ga_dims, ndim);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map64(block, ndim, map);

    _ga_irreg_flag = 1; /* set this flag=1, to indicate array is irregular */
    st = wnga_create_irreg_config(type, (Integer)ndim, _ga_dims, name,
            _ga_map_capi, _ga_work, (Integer)p_handle, &g_a);
    _ga_irreg_flag = 0; /* unset it, after creating array */

    free(_ga_map_capi);
    if(st==TRUE) return (int) g_a;
    else return 0;
}